

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_search_tree_kernel_2.h
# Opt level: O3

void __thiscall
dlib::
binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::logger_header_container,_std::default_delete<dlib::logger::global_data::logger_header_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::delete_tree(binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::logger_header_container,_std::default_delete<dlib::logger::global_data::logger_header_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *this,node *t)

{
  pointer pcVar1;
  node *t_00;
  
  t_00 = t->left;
  if (t_00 != this->NIL) {
    delete_tree(this,t_00);
    t_00 = this->NIL;
  }
  if (t->right != t_00) {
    delete_tree(this,t->right);
  }
  std::
  unique_ptr<dlib::logger::global_data::logger_header_container,_std::default_delete<dlib::logger::global_data::logger_header_container>_>
  ::~unique_ptr(&t->r);
  pcVar1 = (t->d)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(t->d).field_2) {
    operator_delete(pcVar1);
  }
  operator_delete(t);
  return;
}

Assistant:

void binary_search_tree_kernel_2<domain,range,mem_manager,compare>::
    delete_tree (
        node* t
    )  
    {
        if (t->left != NIL)
            delete_tree(t->left);
        if (t->right != NIL)
            delete_tree(t->right);
        pool.deallocate(t);
    }